

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::make_uniq_base<duckdb::LogicalOperator,duckdb::LogicalDummyScan,unsigned_long>
          (duckdb *this,unsigned_long *args)

{
  LogicalDummyScan *this_00;
  
  this_00 = (LogicalDummyScan *)operator_new(0x70);
  LogicalDummyScan::LogicalDummyScan(this_00,*args);
  *(LogicalDummyScan **)this = this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}